

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

void j2k_read_sod(opj_j2k_t *j2k)

{
  opj_cio_t *cio;
  uint uVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  
  cio = j2k->cio;
  iVar5 = j2k->curtileno;
  if (j2k->cstr_info != (opj_codestream_info_t *)0x0) {
    iVar2 = cio_tell(cio);
    iVar3 = j2k->cur_tp_num;
    j2k->cstr_info->tile[j2k->curtileno].tp[iVar3].tp_end_header = iVar2 + j2k->pos_correction + -1;
    if ((long)iVar3 == 0) {
      iVar3 = cio_tell(cio);
      j2k->cstr_info->tile[j2k->curtileno].end_header = iVar3 + j2k->pos_correction + -1;
    }
    j2k->cstr_info->packno = 0;
  }
  iVar3 = *(int *)&j2k->eot;
  puVar4 = cio_getbp(cio);
  uVar6 = iVar3 - (int)puVar4;
  iVar3 = cio_numbytesleft(cio);
  uVar1 = iVar3 + 1U;
  if ((int)uVar6 < (int)(iVar3 + 1U)) {
    uVar1 = uVar6;
  }
  iVar3 = cio_numbytesleft(cio);
  puVar4 = (uchar *)realloc(j2k->tile_data[iVar5],(long)j2k->tile_len[iVar5] + (long)(int)uVar1);
  if (0 < (int)uVar1) {
    iVar2 = j2k->tile_len[iVar5];
    uVar7 = 0;
    do {
      uVar6 = cio_read(cio,1);
      puVar4[uVar7 + (long)iVar2] = (uchar)uVar6;
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
  }
  j2k->tile_len[iVar5] = j2k->tile_len[iVar5] + uVar1;
  j2k->tile_data[iVar5] = puVar4;
  iVar5 = 8;
  if (uVar1 == iVar3 + 1U) {
    iVar5 = 0x40;
  }
  j2k->state = iVar5;
  j2k->cur_tp_num = j2k->cur_tp_num + 1;
  return;
}

Assistant:

static void j2k_read_sod(opj_j2k_t *j2k) {
	int len, truncate = 0, i;
	unsigned char *data = NULL, *data_ptr = NULL;

	opj_cio_t *cio = j2k->cio;
	int curtileno = j2k->curtileno;

	/* Index */
	if (j2k->cstr_info) {
		j2k->cstr_info->tile[j2k->curtileno].tp[j2k->cur_tp_num].tp_end_header =
			cio_tell(cio) + j2k->pos_correction - 1;
		if (j2k->cur_tp_num == 0)
			j2k->cstr_info->tile[j2k->curtileno].end_header = cio_tell(cio) + j2k->pos_correction - 1;
		j2k->cstr_info->packno = 0;
	}
	
	len = int_min(j2k->eot - cio_getbp(cio), cio_numbytesleft(cio) + 1);

	if (len == cio_numbytesleft(cio) + 1) {
		truncate = 1;		/* Case of a truncate codestream */
	}	

	data = j2k->tile_data[curtileno];
	data = (unsigned char*) opj_realloc(data, (j2k->tile_len[curtileno] + len) * sizeof(unsigned char));

	data_ptr = data + j2k->tile_len[curtileno];
	for (i = 0; i < len; i++) {
		data_ptr[i] = cio_read(cio, 1);
	}

	j2k->tile_len[curtileno] += len;
	j2k->tile_data[curtileno] = data;
	
	if (!truncate) {
		j2k->state = J2K_STATE_TPHSOT;
	} else {
		j2k->state = J2K_STATE_NEOC;	/* RAJOUTE !! */
	}
	j2k->cur_tp_num++;
}